

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

float rsg::SubOp::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  bool bVar1;
  VariableType *pVVar2;
  float fVar3;
  GeneratorState *state_local;
  
  pVVar2 = ConstValueRangeAccess::getType(&valueRange);
  bVar1 = VariableType::isVoid(pVVar2);
  if (!bVar1) {
    pVVar2 = ConstValueRangeAccess::getType(&valueRange);
    bVar1 = VariableType::isFloatOrVec(pVVar2);
    if (!bVar1) {
      pVVar2 = ConstValueRangeAccess::getType(&valueRange);
      bVar1 = VariableType::isIntOrVec(pVVar2);
      if (!bVar1) {
        return 0.0;
      }
    }
  }
  fVar3 = BinaryOp<5,_(rsg::Associativity)0>::getWeight(state,valueRange);
  return fVar3;
}

Assistant:

float SubOp::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (valueRange.getType().isVoid() ||
		valueRange.getType().isFloatOrVec() ||
		valueRange.getType().isIntOrVec())
		return SubBase::getWeight(state, valueRange);
	else
		return 0.0f;
}